

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CorrelationModel.cpp
# Opt level: O0

string * __thiscall
csm::CorrelationModel::getDecorrelationEventTime_abi_cxx11_
          (CorrelationModel *this,size_t cpGroupIndex)

{
  size_type sVar1;
  Error *this_00;
  const_reference pvVar2;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ErrorType local_1c;
  size_type local_18;
  size_t cpGroupIndex_local;
  CorrelationModel *this_local;
  
  local_18 = cpGroupIndex;
  cpGroupIndex_local = (size_t)this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->theDecorrelationEventTimes);
  if (sVar1 <= cpGroupIndex) {
    this_00 = (Error *)__cxa_allocate_exception(0x50);
    local_1c = INDEX_OUT_OF_RANGE;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Correlation parameter group index is out of range.",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"csm::CorrelationModel::getDecorrelationEventTime",&local_79);
    Error::Error(this_00,&local_1c,&local_40,&local_78);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->theDecorrelationEventTimes,local_18);
  return pvVar2;
}

Assistant:

const std::string&
CorrelationModel::getDecorrelationEventTime(size_t cpGroupIndex) const
{
   if (cpGroupIndex >= theDecorrelationEventTimes.size())
   {
      throw Error(Error::INDEX_OUT_OF_RANGE,
                  "Correlation parameter group index is out of range.",
                  "csm::CorrelationModel::getDecorrelationEventTime");
   }

   return theDecorrelationEventTimes[cpGroupIndex];
}